

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

IAnimatedMesh * __thiscall
irr::scene::CSceneManager::getUncachedMesh
          (CSceneManager *this,IReadFile *file,path *filename,path *cachename)

{
  int *piVar1;
  IMeshLoader *pIVar2;
  _func_int *p_Var3;
  int iVar4;
  IAnimatedMesh *pIVar5;
  uint uVar6;
  long lVar7;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined4 extraout_var;
  
  uVar6 = (uint)((ulong)((long)(this->MeshLoaderList).m_data.
                               super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->MeshLoaderList).m_data.
                              super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar6) {
    lVar7 = (ulong)(uVar6 & 0x7fffffff) + 1;
    do {
      pIVar2 = (this->MeshLoaderList).m_data.
               super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7 + -2];
      iVar4 = (*pIVar2->_vptr_IMeshLoader[2])(pIVar2,filename);
      in_XMM0_Qa = extraout_XMM0_Qa;
      if ((char)iVar4 != '\0') {
        (*file->_vptr_IReadFile[1])(file,0,0);
        pIVar2 = (this->MeshLoaderList).m_data.
                 super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar7 + -2];
        iVar4 = (*pIVar2->_vptr_IMeshLoader[3])(pIVar2,file);
        pIVar5 = (IAnimatedMesh *)CONCAT44(extraout_var,iVar4);
        in_XMM0_Qa = extraout_XMM0_Qa_00;
        if (pIVar5 != (IAnimatedMesh *)0x0) {
          (*this->MeshCache->_vptr_IMeshCache[2])(this->MeshCache,cachename,pIVar5);
          p_Var3 = (pIVar5->super_IMesh)._vptr_IMesh[-3];
          piVar1 = (int *)(&(pIVar5->super_IMesh).field_0x10 + (long)p_Var3);
          *piVar1 = *piVar1 + -1;
          in_XMM0_Qa = extraout_XMM0_Qa_01;
          if (*piVar1 == 0) {
            in_XMM0_Qa = (double)(**(code **)(*(long *)((long)&(pIVar5->super_IMesh)._vptr_IMesh +
                                                       (long)p_Var3) + 8))();
          }
          goto LAB_001c65c1;
        }
      }
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  pIVar5 = (IAnimatedMesh *)0x0;
LAB_001c65c1:
  os::Printer::log(in_XMM0_Qa);
  return pIVar5;
}

Assistant:

IAnimatedMesh *CSceneManager::getUncachedMesh(io::IReadFile *file, const io::path &filename, const io::path &cachename)
{
	IAnimatedMesh *msh = 0;

	// iterate the list in reverse order so user-added loaders can override the built-in ones
	s32 count = MeshLoaderList.size();
	for (s32 i = count - 1; i >= 0; --i) {
		if (MeshLoaderList[i]->isALoadableFileExtension(filename)) {
			// reset file to avoid side effects of previous calls to createMesh
			file->seek(0);
			msh = MeshLoaderList[i]->createMesh(file);
			if (msh) {
				MeshCache->addMesh(cachename, msh);
				msh->drop();
				break;
			}
		}
	}

	if (!msh)
		os::Printer::log("Could not load mesh, file format seems to be unsupported", filename, ELL_ERROR);
	else
		os::Printer::log("Loaded mesh", filename, ELL_DEBUG);

	return msh;
}